

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndsWithTest.cpp
# Opt level: O1

void __thiscall oout::EndsWithTest::EndsWithTest(EndsWithTest *this,string *a,string *b)

{
  undefined1 local_39;
  StringText *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  shared_ptr<const_oout::Text> local_28;
  
  local_38 = (StringText *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::StringText,std::allocator<oout::StringText>,std::__cxx11::string_const&>
            (&_Stack_30,&local_38,(allocator<oout::StringText> *)&local_39,a);
  local_28.super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_38->super_Text;
  local_28.super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_30._M_pi;
  local_38 = (StringText *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  EndsWithTest(this,&local_28,b);
  if (local_28.super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  return;
}

Assistant:

EndsWithTest::EndsWithTest(const string &a, const string &b)
	: EndsWithTest(make_shared<StringText>(a), b)
{
}